

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Attribute_PDU::ClearAttributeRecordSet(Attribute_PDU *this)

{
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  std::
  vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  ::clear(&this->m_vAttributeRecordSets);
  return;
}

Assistant:

void Attribute_PDU::ClearAttributeRecordSet()
{
    // Reset the pdu length
    m_ui16PDULength = ATTRIBUTE_PDU_SIZE;
    m_vAttributeRecordSets.clear();
}